

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::StructPackingPass::getPackedAlignment(StructPackingPass *this,Type *type)

{
  undefined8 *puVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar5;
  uint uVar6;
  undefined8 *puVar7;
  
  uVar5 = 0;
  while (type->kind_ == kArray) {
    uVar6 = 1;
    if ((this->packingRules_ - Std140 & 0xfffffffa) == 0) {
      uVar6 = 0x10;
    }
    iVar2 = (*type->_vptr_Type[0x18])(type);
    type = *(Type **)(CONCAT44(extraout_var,iVar2) + 0x28);
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
  }
  if (type->kind_ == kStruct) {
    iVar2 = (*type->_vptr_Type[0x1c])(type);
    puVar7 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar2) + 0x28);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar2) + 0x30);
    if (puVar7 == puVar1) {
      uVar4 = 1;
    }
    else {
      uVar4 = 1;
      do {
        uVar3 = getPackedAlignment(this,(Type *)*puVar7);
        if (uVar3 < uVar4) {
          uVar3 = uVar4;
        }
        uVar4 = uVar3;
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
    }
    if (((this->packingRules_ - Std140 & 0xfffffffa) == 0) && (uVar4 < 0x11)) {
      uVar4 = 0x10;
    }
    goto LAB_0019f534;
  }
  uVar4 = getPackedBaseSize(type);
  if (this->packingRules_ - Scalar < 2) goto LAB_0019f534;
  iVar2 = (*type->_vptr_Type[0x10])(type);
  if (CONCAT44(extraout_var_01,iVar2) == 0) {
    iVar2 = (*type->_vptr_Type[0xe])(type);
    if ((CONCAT44(extraout_var_02,iVar2) == 0) ||
       (iVar2 = *(int *)(CONCAT44(extraout_var_02,iVar2) + 0x30), iVar2 == 1)) goto LAB_0019f534;
    if ((iVar2 == 4) || (iVar2 == 2)) goto LAB_0019f527;
    if (iVar2 != 3) {
      __assert_fail("0 && \"Unrecognized type to get packed alignment\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                    ,0xde,
                    "uint32_t spvtools::opt::StructPackingPass::getPackedAlignment(const analysis::Type &) const"
                   );
    }
  }
  else if (((this->packingRules_ - Std140 & 0xfffffffa) != 0) &&
          (iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 0x30), iVar2 != 3)) {
LAB_0019f527:
    uVar4 = uVar4 * iVar2;
    goto LAB_0019f534;
  }
  uVar4 = uVar4 << 2;
LAB_0019f534:
  if (uVar5 < uVar4) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

uint32_t StructPackingPass::getPackedAlignment(
    const analysis::Type& type) const {
  switch (type.kind()) {
    case analysis::Type::kArray: {
      // Get alignment of base type and round up to minimum alignment
      const uint32_t minAlignment = isPackingVec4Padded(packingRules_) ? 16 : 1;
      return std::max<uint32_t>(
          minAlignment, getPackedAlignment(*type.AsArray()->element_type()));
    }
    case analysis::Type::kStruct: {
      // Rule 9. Struct alignment is maximum alignmnet of its members
      uint32_t alignment = 1;

      for (const analysis::Type* elementType :
           type.AsStruct()->element_types()) {
        alignment =
            std::max<uint32_t>(alignment, getPackedAlignment(*elementType));
      }

      if (isPackingVec4Padded(packingRules_))
        alignment = std::max<uint32_t>(alignment, 16u);

      return alignment;
    }
    default: {
      const uint32_t baseAlignment = getPackedBaseSize(type);

      // Scalar block layout always uses alignment for the most basic component
      if (isPackingScalar(packingRules_)) return baseAlignment;

      if (const analysis::Matrix* matrixType = type.AsMatrix()) {
        // Rule 5/7
        if (isPackingVec4Padded(packingRules_) ||
            matrixType->element_count() == 3)
          return baseAlignment * 4;
        else
          return baseAlignment * matrixType->element_count();
      } else if (const analysis::Vector* vectorType = type.AsVector()) {
        // Rule 1
        if (vectorType->element_count() == 1) return baseAlignment;

        // Rule 2
        if (vectorType->element_count() == 2 ||
            vectorType->element_count() == 4)
          return baseAlignment * vectorType->element_count();

        // Rule 3
        if (vectorType->element_count() == 3) return baseAlignment * 4;
      } else {
        // Rule 1
        return baseAlignment;
      }
    }
  }
  assert(0 && "Unrecognized type to get packed alignment");
  return 0;
}